

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float __thiscall
ImGuiMenuColumns::DeclColumns
          (ImGuiMenuColumns *this,float w_icon,float w_label,float w_shortcut,float w_mark)

{
  ulong uVar1;
  ImU16 IVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  ushort uVar7;
  ImU16 IVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar9._0_4_ = (int)w_icon;
  auVar9._4_4_ = (int)w_label;
  auVar9._8_4_ = (int)w_shortcut;
  auVar9._12_4_ = (int)w_mark;
  auVar9 = pshuflw(auVar9,auVar9,0xe8);
  auVar9 = pshufhw(auVar9,auVar9,0xe8);
  auVar10._0_4_ = auVar9._0_4_;
  auVar10._8_4_ = auVar9._8_4_;
  auVar10._12_4_ = auVar9._12_4_;
  auVar10._4_4_ = auVar10._8_4_;
  uVar1 = *(ulong *)this->Widths;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar9 = psubusw(auVar10,auVar11);
  *(ulong *)this->Widths =
       CONCAT26(auVar9._6_2_ + (short)(uVar1 >> 0x30),
                CONCAT24(auVar9._4_2_ + (short)(uVar1 >> 0x20),
                         CONCAT22(auVar9._2_2_ + (short)(uVar1 >> 0x10),auVar9._0_2_ + (short)uVar1)
                        ));
  lVar5 = 9;
  uVar7 = 0;
  bVar6 = false;
  do {
    IVar2 = this->Widths[lVar5 + -9];
    IVar8 = this->Spacing;
    if (IVar2 == 0) {
      IVar8 = 0;
    }
    if (!bVar6) {
      IVar8 = 0;
    }
    bVar6 = (bool)(bVar6 | IVar2 != 0);
    uVar7 = IVar2 + uVar7 + IVar8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xd);
  this->NextTotalWidth = (uint)uVar7;
  uVar3 = this->TotalWidth;
  uVar4 = (uint)uVar7;
  if (uVar7 <= uVar3 && uVar3 != uVar7) {
    uVar4 = uVar3;
  }
  return (float)uVar4;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w_icon, float w_label, float w_shortcut, float w_mark)
{
    Widths[0] = ImMax(Widths[0], (ImU16)w_icon);
    Widths[1] = ImMax(Widths[1], (ImU16)w_label);
    Widths[2] = ImMax(Widths[2], (ImU16)w_shortcut);
    Widths[3] = ImMax(Widths[3], (ImU16)w_mark);
    CalcNextTotalWidth(false);
    return (float)ImMax(TotalWidth, NextTotalWidth);
}